

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O0

ly_set * lyd_find_path(lyd_node *ctx_node,char *path)

{
  char *expr;
  int iVar1;
  lys_module *plVar2;
  uint local_a0;
  int local_9c;
  uint32_t i;
  int is_relative;
  int name_len;
  int mod_name_len;
  char *name;
  char *mod_name;
  char *node_mod_name;
  char *yang_xpath;
  ly_set *set;
  lyxp_set xp_set;
  char *local_20;
  char *path_local;
  lyd_node *ctx_node_local;
  
  local_9c = -1;
  if ((ctx_node == (lyd_node *)0x0) || (path == (char *)0x0)) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid arguments (%s()).","lyd_find_path");
    ctx_node_local = (lyd_node *)0x0;
  }
  else {
    iVar1 = parse_schema_nodeid(path,&name,&is_relative,(char **)&name_len,(int *)&i,&local_9c,
                                (int *)0x0,(int *)0x0,1);
    local_20 = path;
    if (((0 < iVar1) && (*_name_len == '#')) && (local_9c == 0)) {
      plVar2 = lyd_node_module(ctx_node);
      mod_name = plVar2->name;
      iVar1 = strncmp(name,mod_name,(long)is_relative);
      if ((iVar1 != 0) || (mod_name[is_relative] != '\0')) {
        return (ly_set *)0x0;
      }
      local_20 = _name_len + (int)i;
    }
    plVar2 = lyd_node_module(ctx_node);
    node_mod_name = transform_json2xpath(plVar2,local_20);
    if (node_mod_name == (char *)0x0) {
      ctx_node_local = (lyd_node *)0x0;
    }
    else {
      memset(&set,0,0x40);
      expr = node_mod_name;
      plVar2 = lyd_node_module(ctx_node);
      iVar1 = lyxp_eval(expr,ctx_node,LYXP_NODE_ELEM,plVar2,(lyxp_set *)&set,0);
      if (iVar1 == 0) {
        free(node_mod_name);
        yang_xpath = (char *)ly_set_new();
        if ((ly_set *)yang_xpath == (ly_set *)0x0) {
          ly_log(ctx_node->schema->module->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                 "lyd_find_path");
          ctx_node_local = (lyd_node *)0x0;
        }
        else {
          if ((int)set == 1) {
            for (local_a0 = 0; local_a0 < (uint)xp_set.val._8_4_; local_a0 = local_a0 + 1) {
              if ((*(int *)(xp_set._8_8_ + (ulong)local_a0 * 0x10 + 8) == 2) &&
                 (iVar1 = ly_set_add((ly_set *)yang_xpath,
                                     *(void **)(xp_set._8_8_ + (ulong)local_a0 * 0x10),1), iVar1 < 0
                 )) {
                ly_set_free((ly_set *)yang_xpath);
                yang_xpath = (char *)0x0;
                break;
              }
            }
          }
          lyxp_set_cast((lyxp_set *)&set,LYXP_SET_EMPTY,ctx_node,(lys_module *)0x0,0);
          ctx_node_local = (lyd_node *)yang_xpath;
        }
      }
      else {
        free(node_mod_name);
        ctx_node_local = (lyd_node *)0x0;
      }
    }
  }
  return (ly_set *)ctx_node_local;
}

Assistant:

ly_set *
lyd_find_path(const struct lyd_node *ctx_node, const char *path)
{
    struct lyxp_set xp_set;
    struct ly_set *set;
    char *yang_xpath;
    const char * node_mod_name, *mod_name, *name;
    int mod_name_len, name_len, is_relative = -1;
    uint32_t i;

    if (!ctx_node || !path) {
        LOGARG;
        return NULL;
    }

    if (parse_schema_nodeid(path, &mod_name, &mod_name_len, &name, &name_len, &is_relative, NULL, NULL, 1) > 0) {
        if (name[0] == '#' && !is_relative) {
            node_mod_name = lyd_node_module(ctx_node)->name;
            if (strncmp(mod_name, node_mod_name, mod_name_len) || node_mod_name[mod_name_len]) {
                return NULL;
            }
            path = name + name_len;
        }
    }

    /* transform JSON into YANG XPATH */
    yang_xpath = transform_json2xpath(lyd_node_module(ctx_node), path);
    if (!yang_xpath) {
        return NULL;
    }

    memset(&xp_set, 0, sizeof xp_set);

    if (lyxp_eval(yang_xpath, ctx_node, LYXP_NODE_ELEM, lyd_node_module(ctx_node), &xp_set, 0) != EXIT_SUCCESS) {
        free(yang_xpath);
        return NULL;
    }
    free(yang_xpath);

    set = ly_set_new();
    LY_CHECK_ERR_RETURN(!set, LOGMEM(ctx_node->schema->module->ctx), NULL);

    if (xp_set.type == LYXP_SET_NODE_SET) {
        for (i = 0; i < xp_set.used; ++i) {
            if (xp_set.val.nodes[i].type == LYXP_NODE_ELEM) {
                if (ly_set_add(set, xp_set.val.nodes[i].node, LY_SET_OPT_USEASLIST) < 0) {
                    ly_set_free(set);
                    set = NULL;
                    break;
                }
            }
        }
    }
    /* free xp_set content */
    lyxp_set_cast(&xp_set, LYXP_SET_EMPTY, ctx_node, NULL, 0);

    return set;
}